

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgcrypto.hpp
# Opt level: O1

string * ws::wx_decode_base64(string *__return_storage_ptr__,string *str_encrypt)

{
  uchar *f;
  size_type sVar1;
  int iVar2;
  uchar *puVar3;
  runtime_error *prVar4;
  int iVar5;
  int n;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  f = (uchar *)(str_encrypt->_M_dataplus)._M_p;
  sVar1 = str_encrypt->_M_string_length;
  if ((long)sVar1 < 1) {
    iVar5 = 0;
  }
  else {
    puVar3 = f + sVar1;
    iVar5 = 0;
    do {
      if (puVar3[-1] != '=') break;
      puVar3 = puVar3 + -1;
      iVar5 = iVar5 + 1;
    } while (f < puVar3);
  }
  n = (int)sVar1;
  puVar3 = (uchar *)malloc((long)n);
  if (puVar3 == (uchar *)0x0) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x18);
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"malloc error","");
    std::runtime_error::runtime_error(prVar4,(string *)local_50);
    *(undefined ***)prVar4 = &PTR__runtime_error_0019fd30;
    *(undefined ***)(prVar4 + 0x10) = &PTR_s__workspace_llm4binary_github_lic_0019f0f0;
    __cxa_throw(prVar4,&MsgCryptoError::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar2 = EVP_DecodeBlock(puVar3,f,n);
  if ((iVar2 - iVar5 != 0 && iVar5 <= iVar2) && (iVar2 < n)) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (__return_storage_ptr__,0,__return_storage_ptr__->_M_string_length,(char *)puVar3,
               (long)(iVar2 - iVar5));
    free(puVar3);
    return __return_storage_ptr__;
  }
  prVar4 = (runtime_error *)__cxa_allocate_exception(0x18);
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"EVP_DecodeBlock() error","");
  std::runtime_error::runtime_error(prVar4,(string *)local_70);
  *(undefined ***)prVar4 = &PTR__runtime_error_0019fd30;
  *(undefined ***)(prVar4 + 0x10) = &PTR_s__workspace_llm4binary_github_lic_0019f108;
  __cxa_throw(prVar4,&MsgCryptoError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::string wx_decode_base64(const std::string &str_encrypt)
  {
    std::string ret;
    int eq = 0;
    for (auto r = str_encrypt.crbegin(); r < str_encrypt.crend(); r++)
    {
      if (*r == '=')
      {
        eq++;
      }
      else
      {
        break;
      }
    }
    
    int osize = int(str_encrypt.size());
    char *out = (char *) malloc(osize);
    if (out == nullptr)
    {
      throw MsgCryptoError("malloc error");
    }
    
    int rsize = 0;
    rsize = EVP_DecodeBlock((unsigned char *) out, (const unsigned char *) str_encrypt.c_str(),
                            int(str_encrypt.size()));
    if (rsize > eq && rsize < osize)
    {
      ret.assign(out, rsize - eq);
    }
    else
    {
      throw MsgCryptoError("EVP_DecodeBlock() error");
    }
    
    free(out);
    out = nullptr;
    return ret;
  }